

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

double __thiscall sector_t::HighestCeilingAt(sector_t *this,DVector2 *p,sector_t **resultsec)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  undefined1 local_50 [24];
  DVector2 pos;
  double planeheight;
  sector_t *check;
  sector_t **resultsec_local;
  DVector2 *p_local;
  sector_t *this_local;
  
  pos.Y = -3.4028234663852886e+38;
  TVector2<double>::TVector2((TVector2<double> *)(local_50 + 0x10),p);
  planeheight = (double)this;
  while( true ) {
    bVar2 = PortalBlocksMovement((sector_t *)planeheight,1);
    dVar4 = pos.Y;
    bVar1 = false;
    if (!bVar2) {
      dVar3 = GetPortalPlaneZ((sector_t *)planeheight,1);
      bVar1 = dVar4 < dVar3;
    }
    if (!bVar1) break;
    GetPortalDisplacement((sector_t *)local_50,SUB84(planeheight,0));
    TVector2<double>::operator+=((TVector2<double> *)(local_50 + 0x10),(TVector2<double> *)local_50)
    ;
    pos.Y = GetPortalPlaneZ((sector_t *)planeheight,1);
    planeheight = (double)P_PointInSector((DVector2 *)(local_50 + 0x10));
  }
  if (resultsec != (sector_t **)0x0) {
    *resultsec = (sector_t *)planeheight;
  }
  dVar4 = secplane_t::ZatPoint
                    ((secplane_t *)((long)planeheight + 0xd8),(DVector2 *)(local_50 + 0x10));
  return dVar4;
}

Assistant:

double sector_t::HighestCeilingAt(const DVector2 &p, sector_t **resultsec)
{
	sector_t *check = this;
	double planeheight = -FLT_MAX;
	DVector2 pos = p;

	// Continue until we find a blocking portal or a portal below where we actually are.
	while (!check->PortalBlocksMovement(ceiling) && planeheight < check->GetPortalPlaneZ(ceiling))
	{
		pos += check->GetPortalDisplacement(ceiling);
		planeheight = check->GetPortalPlaneZ(ceiling);
		check = P_PointInSector(pos);
	}
	if (resultsec) *resultsec = check;
	return check->ceilingplane.ZatPoint(pos);
}